

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

int generate_C_code(Ravi_CompilerInterface *ravi_interface,Proc *proc,TextBuffer *mb)

{
  TextBuffer *mb_00;
  TextBuffer *mb_01;
  uint uVar1;
  BasicBlock *pBVar2;
  int iVar3;
  Proc *proc_00;
  long lVar4;
  Function fn;
  Function local_168;
  
  mb_00 = &local_168.prologue;
  local_168.proc = proc;
  local_168.api = ravi_interface;
  snprintf(proc->funcname,0x1e,"__ravifunc_%d",(ulong)proc->id);
  raviX_buffer_init(mb_00,0x1000);
  raviX_buffer_init(&local_168.body,0x1000);
  raviX_buffer_init(&local_168.tb,0x100);
  raviX_buffer_init(&local_168.C_local_declarations,0x100);
  raviX_buffer_add_fstring(mb_00,"static int %s(lua_State *L) {\n",proc->funcname);
  raviX_buffer_add_string(mb_00,"int raviX__error_code = 0;\n");
  raviX_buffer_add_string(mb_00,"int result = 0;\n");
  raviX_buffer_add_string(mb_00,"CallInfo *ci = L->ci;\n");
  raviX_buffer_add_string(mb_00,"LClosure *cl = clLvalue(ci->func);\n");
  raviX_buffer_add_string(mb_00,"TValue *k = cl->p->k;\n");
  raviX_buffer_add_string(mb_00,"StkId base = ci->u.l.base;\n");
  emit_vars("lua_Integer","raviX__i_",(PseudoGenerator *)(ulong)(proc->temp_int_pseudos).max_reg,
            mb_00);
  emit_vars("lua_Number","raviX__f_",(PseudoGenerator *)(ulong)(proc->temp_flt_pseudos).max_reg,
            mb_00);
  emit_vars("lua_Integer","raviX__i_",(PseudoGenerator *)(ulong)(proc->temp_int_pseudos).max_reg,
            &local_168.C_local_declarations);
  emit_vars("lua_Number","raviX__f_",(PseudoGenerator *)(ulong)(proc->temp_flt_pseudos).max_reg,
            &local_168.C_local_declarations);
  raviX_buffer_add_string(mb_00,"TValue ival0; settt_(&ival0, LUA_TNUMINT);\n");
  raviX_buffer_add_string(mb_00,"TValue fval0; settt_(&fval0, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(mb_00,"TValue bval0; settt_(&bval0, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(mb_00,"TValue ival1; settt_(&ival1, LUA_TNUMINT);\n");
  raviX_buffer_add_string(mb_00,"TValue fval1; settt_(&fval1, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(mb_00,"TValue bval1; settt_(&bval1, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(mb_00,"TValue ival2; settt_(&ival2, LUA_TNUMINT);\n");
  raviX_buffer_add_string(mb_00,"TValue fval2; settt_(&fval2, LUA_TNUMFLT);\n");
  raviX_buffer_add_string(mb_00,"TValue bval2; settt_(&bval2, LUA_TBOOLEAN);\n");
  raviX_buffer_add_string(mb_00,"TValue nilval; setnilvalue(&nilval);\n");
  iVar3 = _setjmp((__jmp_buf_tag *)local_168.env);
  if (iVar3 == 0) {
    iVar3 = 0;
    if (0 < (int)proc->node_count) {
      lVar4 = 0;
      do {
        pBVar2 = proc->nodes[lVar4];
        uVar1 = pBVar2->index;
        if (uVar1 < 2) {
LAB_0011e1cf:
          raviX_buffer_add_fstring(&local_168.body,"L%d:\n",(ulong)uVar1);
          iVar3 = output_instructions(&local_168,pBVar2->insns);
          if (pBVar2->index == 1) {
            mb_01 = &local_168.body;
            raviX_buffer_add_string(mb_01," return result;\n");
            raviX_buffer_add_string(mb_01,"Lraise_error:\n");
            raviX_buffer_add_string
                      (mb_01," raviV_raise_error(L, raviX__error_code); /* does not return */\n");
            raviX_buffer_add_string(mb_01," return result;\n");
          }
          if (iVar3 != 0) goto LAB_0011e261;
        }
        else {
          iVar3 = raviX_ptrlist_size((PtrList *)pBVar2->insns);
          if (iVar3 != 0) {
            uVar1 = pBVar2->index;
            goto LAB_0011e1cf;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)proc->node_count);
      iVar3 = 0;
    }
LAB_0011e261:
    raviX_buffer_add_string(&local_168.body,"}\n");
    raviX_buffer_add_string(mb,local_168.prologue.buf);
    raviX_buffer_add_string(mb,local_168.body.buf);
  }
  raviX_buffer_free(mb_00);
  raviX_buffer_free(&local_168.body);
  raviX_buffer_free(&local_168.tb);
  raviX_buffer_free(&local_168.C_local_declarations);
  if (iVar3 == 0) {
    raviX_ptrlist_forward_iterator((PtrListIterator *)&local_168,(PtrList *)proc->procs);
    proc_00 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&local_168);
    iVar3 = 0;
    if (proc_00 != (Proc *)0x0) {
      do {
        iVar3 = generate_C_code(ravi_interface,proc_00,mb);
        if (iVar3 != 0) {
          return iVar3;
        }
        proc_00 = (Proc *)raviX_ptrlist_iter_next((PtrListIterator *)&local_168);
        iVar3 = 0;
      } while (proc_00 != (Proc *)0x0);
    }
  }
  return iVar3;
}

Assistant:

static int generate_C_code(struct Ravi_CompilerInterface *ravi_interface, Proc *proc, TextBuffer *mb)
{
	int rc = 0;
	{
		Function fn;
		initfn(&fn, proc, ravi_interface);
		rc = setjmp(fn.env);
		if (rc == 0) {
			BasicBlock *bb;
			for (int i = 0; i < (int)proc->node_count; i++) {
				bb = proc->nodes[i];
				rc = output_basic_block(&fn, bb);
				if (rc != 0)
					break;
			}

			raviX_buffer_add_string(&fn.body, "}\n");
			raviX_buffer_add_string(mb, fn.prologue.buf);
			raviX_buffer_add_string(mb, fn.body.buf);
		}
		cleanup(&fn);
	}
	if (rc != 0)
		return rc;

	Proc *childproc;
	FOR_EACH_PTR(proc->procs, Proc, childproc)
	{
		rc = generate_C_code(ravi_interface, childproc, mb);
		if (rc != 0)
			return rc;
	}
	END_FOR_EACH_PTR(childproc)
	return 0;
}